

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O1

void cilk_fiber_pool_free_fibers_from_pool
               (cilk_fiber_pool *pool,uint num_to_keep,cilk_fiber *fiber_to_return)

{
  ulong uVar1;
  spin_mutex *psVar2;
  cilk_fiber **ppcVar3;
  cilk_fiber_sysdep *this;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  cilk_fiber_sysdep *self;
  ulong uVar9;
  bool bVar10;
  cilk_fiber *fibers_to_free [10];
  undefined8 auStack_88 [11];
  
  psVar2 = pool->lock;
  bVar6 = false;
  do {
    if (psVar2 != (spin_mutex *)0x0) {
      spin_mutex_lock(pool->lock);
    }
    uVar5 = pool->size;
    uVar9 = 0;
    bVar4 = num_to_keep < uVar5;
    if (num_to_keep < uVar5) {
      ppcVar3 = pool->fibers;
      lVar7 = -1;
      uVar8 = 0;
      do {
        uVar1 = (ulong)uVar5 + lVar7;
        uVar9 = uVar8 + 1;
        auStack_88[uVar8] = ppcVar3[(ulong)uVar5 + lVar7];
        bVar4 = num_to_keep < uVar1;
        if (uVar1 <= num_to_keep) break;
        lVar7 = lVar7 + -1;
        bVar10 = uVar8 < 9;
        uVar8 = uVar9;
      } while (bVar10);
      uVar5 = uVar5 - (int)uVar9;
      pool->size = uVar5;
    }
    pool->total = pool->total - (int)uVar9;
    if (!bVar4) {
      bVar6 = true;
    }
    if (!(bool)(fiber_to_return == (cilk_fiber *)0x0 | bVar4)) {
      if (pool->max_size <= uVar5) {
        cilk_fiber_pool_free_fibers_from_pool();
      }
      pool->fibers[uVar5] = fiber_to_return;
      pool->size = uVar5 + 1;
      bVar6 = true;
    }
    if (psVar2 != (spin_mutex *)0x0) {
      spin_mutex_unlock(pool->lock);
    }
    if ((int)uVar9 != 0) {
      uVar8 = 0;
      do {
        this = (cilk_fiber_sysdep *)auStack_88[uVar8];
        cilk_fiber_sysdep::~cilk_fiber_sysdep(this);
        __cilkrts_free(this);
        uVar8 = uVar8 + 1;
      } while ((uVar9 & 0xffffffff) != uVar8);
    }
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

static void cilk_fiber_pool_free_fibers_from_pool(cilk_fiber_pool* pool,
                                                  unsigned num_to_keep,
                                                  cilk_fiber* fiber_to_return)
{
    // Free our own fibers, until we fall below our desired threshold.
    // Each iteration of this loop proceeds in the following stages:
    //   1.  Acquire the pool lock,
    //   2.  Grabs up to B fibers from the pool, stores them into a buffer.
    //   3.  Check if pool is empty enough.  If yes, put the last fiber back,
    //       and remember that we should quit.
    //   4.  Release the pool lock, and actually free any buffered fibers.
    //   5.  Check if we are done and should exit the loop.  Otherwise, try again.
    // 
    const bool need_lock = pool->lock;
    bool last_fiber_returned = false;
    
    do {
        const int B = 10;   // Pull at most this many fibers from the
                            // parent for one lock acquisition.  Make
                            // this value large enough to amortize
                            // against the cost of acquiring and
                            // releasing the lock.
        int num_to_free = 0;
        cilk_fiber* fibers_to_free[B];

        // Stage 1: Grab the lock.
        if (need_lock) {
            spin_mutex_lock(pool->lock);
        }
        
        // Stage 2: Grab up to B fibers to free.
        int fibers_freed = 0;
        while ((pool->size > num_to_keep) && (num_to_free < B)) {
            fibers_to_free[num_to_free++] = pool->fibers[--pool->size];
            fibers_freed++;
        }
        decrement_pool_total(pool, fibers_freed);

        // Stage 3.  Pool is below threshold.  Put extra fiber back.
        if (pool->size <= num_to_keep) {
            // Put the last fiber back into the pool.
            if (fiber_to_return) {
                CILK_ASSERT(pool->size < pool->max_size);
                pool->fibers[pool->size] = fiber_to_return;
                pool->size++;
            }
            last_fiber_returned = true;
        }
        
        // Stage 4: Release the lock, and actually free any fibers
        // buffered.
        if (need_lock) {
            spin_mutex_unlock(pool->lock);
        }

        for (int i = 0; i < num_to_free; ++i) {
            fibers_to_free[i]->deallocate_to_heap();
        }
        
    } while (!last_fiber_returned);
}